

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MMDPmxParser.h
# Opt level: O3

void __thiscall pmx::PmxMorph::~PmxMorph(PmxMorph *this)

{
  PmxMorphImplusOffset *pPVar1;
  PmxMorphFlipOffset *pPVar2;
  PmxMorphGroupOffset *pPVar3;
  PmxMorphMaterialOffset *pPVar4;
  PmxMorphBoneOffset *pPVar5;
  PmxMorphUVOffset *pPVar6;
  PmxMorphVertexOffset *pPVar7;
  pointer pcVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  
  pPVar1 = (this->implus_offsets)._M_t.
           super___uniq_ptr_impl<pmx::PmxMorphImplusOffset,_std::default_delete<pmx::PmxMorphImplusOffset[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxMorphImplusOffset_*,_std::default_delete<pmx::PmxMorphImplusOffset[]>_>
           .super__Head_base<0UL,_pmx::PmxMorphImplusOffset_*,_false>._M_head_impl;
  if (pPVar1 != (PmxMorphImplusOffset *)0x0) {
    operator_delete__(pPVar1);
  }
  (this->implus_offsets)._M_t.
  super___uniq_ptr_impl<pmx::PmxMorphImplusOffset,_std::default_delete<pmx::PmxMorphImplusOffset[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_pmx::PmxMorphImplusOffset_*,_std::default_delete<pmx::PmxMorphImplusOffset[]>_>
  .super__Head_base<0UL,_pmx::PmxMorphImplusOffset_*,_false>._M_head_impl =
       (PmxMorphImplusOffset *)0x0;
  pPVar2 = (this->flip_offsets)._M_t.
           super___uniq_ptr_impl<pmx::PmxMorphFlipOffset,_std::default_delete<pmx::PmxMorphFlipOffset[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxMorphFlipOffset_*,_std::default_delete<pmx::PmxMorphFlipOffset[]>_>
           .super__Head_base<0UL,_pmx::PmxMorphFlipOffset_*,_false>._M_head_impl;
  if (pPVar2 != (PmxMorphFlipOffset *)0x0) {
    operator_delete__(pPVar2);
  }
  (this->flip_offsets)._M_t.
  super___uniq_ptr_impl<pmx::PmxMorphFlipOffset,_std::default_delete<pmx::PmxMorphFlipOffset[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_pmx::PmxMorphFlipOffset_*,_std::default_delete<pmx::PmxMorphFlipOffset[]>_>
  .super__Head_base<0UL,_pmx::PmxMorphFlipOffset_*,_false>._M_head_impl = (PmxMorphFlipOffset *)0x0;
  pPVar3 = (this->group_offsets)._M_t.
           super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
           .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl;
  if (pPVar3 != (PmxMorphGroupOffset *)0x0) {
    operator_delete__(pPVar3);
  }
  (this->group_offsets)._M_t.
  super___uniq_ptr_impl<pmx::PmxMorphGroupOffset,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_pmx::PmxMorphGroupOffset_*,_std::default_delete<pmx::PmxMorphGroupOffset[]>_>
  .super__Head_base<0UL,_pmx::PmxMorphGroupOffset_*,_false>._M_head_impl =
       (PmxMorphGroupOffset *)0x0;
  pPVar4 = (this->material_offsets)._M_t.
           super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
           .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl;
  if (pPVar4 != (PmxMorphMaterialOffset *)0x0) {
    operator_delete__(pPVar4);
  }
  (this->material_offsets)._M_t.
  super___uniq_ptr_impl<pmx::PmxMorphMaterialOffset,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_pmx::PmxMorphMaterialOffset_*,_std::default_delete<pmx::PmxMorphMaterialOffset[]>_>
  .super__Head_base<0UL,_pmx::PmxMorphMaterialOffset_*,_false>._M_head_impl =
       (PmxMorphMaterialOffset *)0x0;
  pPVar5 = (this->bone_offsets)._M_t.
           super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
           .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl;
  if (pPVar5 != (PmxMorphBoneOffset *)0x0) {
    operator_delete__(pPVar5);
  }
  (this->bone_offsets)._M_t.
  super___uniq_ptr_impl<pmx::PmxMorphBoneOffset,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>.
  _M_t.
  super__Tuple_impl<0UL,_pmx::PmxMorphBoneOffset_*,_std::default_delete<pmx::PmxMorphBoneOffset[]>_>
  .super__Head_base<0UL,_pmx::PmxMorphBoneOffset_*,_false>._M_head_impl = (PmxMorphBoneOffset *)0x0;
  pPVar6 = (this->uv_offsets)._M_t.
           super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>
           .super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl;
  if (pPVar6 != (PmxMorphUVOffset *)0x0) {
    operator_delete__(pPVar6);
  }
  (this->uv_offsets)._M_t.
  super___uniq_ptr_impl<pmx::PmxMorphUVOffset,_std::default_delete<pmx::PmxMorphUVOffset[]>_>._M_t.
  super__Tuple_impl<0UL,_pmx::PmxMorphUVOffset_*,_std::default_delete<pmx::PmxMorphUVOffset[]>_>.
  super__Head_base<0UL,_pmx::PmxMorphUVOffset_*,_false>._M_head_impl = (PmxMorphUVOffset *)0x0;
  pPVar7 = (this->vertex_offsets)._M_t.
           super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
           ._M_t.
           super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
           .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl;
  if (pPVar7 != (PmxMorphVertexOffset *)0x0) {
    operator_delete__(pPVar7);
  }
  (this->vertex_offsets)._M_t.
  super___uniq_ptr_impl<pmx::PmxMorphVertexOffset,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_pmx::PmxMorphVertexOffset_*,_std::default_delete<pmx::PmxMorphVertexOffset[]>_>
  .super__Head_base<0UL,_pmx::PmxMorphVertexOffset_*,_false>._M_head_impl =
       (PmxMorphVertexOffset *)0x0;
  pcVar8 = (this->morph_english_name)._M_dataplus._M_p;
  paVar9 = &(this->morph_english_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8 != paVar9) {
    operator_delete(pcVar8,paVar9->_M_allocated_capacity + 1);
  }
  pcVar8 = (this->morph_name)._M_dataplus._M_p;
  paVar9 = &(this->morph_name).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar8 != paVar9) {
    operator_delete(pcVar8,paVar9->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

PmxMorph()
			: offset_count(0)
		{
		}